

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementBackgroundBorder.cpp
# Opt level: O0

Background * __thiscall
Rml::ElementBackgroundBorder::GetOrCreateBackground
          (ElementBackgroundBorder *this,BackgroundType type)

{
  bool bVar1;
  pointer ppVar2;
  Background *background;
  _Self local_28;
  iterator it;
  BackgroundType type_local;
  ElementBackgroundBorder *this_local;
  
  it._M_node._4_4_ = type;
  local_28._M_node =
       (_Base_ptr)
       ::std::
       map<Rml::ElementBackgroundBorder::BackgroundType,_Rml::ElementBackgroundBorder::Background,_std::less<Rml::ElementBackgroundBorder::BackgroundType>,_std::allocator<std::pair<const_Rml::ElementBackgroundBorder::BackgroundType,_Rml::ElementBackgroundBorder::Background>_>_>
       ::find(&this->backgrounds,(key_type *)((long)&it._M_node + 4));
  background = (Background *)
               ::std::
               map<Rml::ElementBackgroundBorder::BackgroundType,_Rml::ElementBackgroundBorder::Background,_std::less<Rml::ElementBackgroundBorder::BackgroundType>,_std::allocator<std::pair<const_Rml::ElementBackgroundBorder::BackgroundType,_Rml::ElementBackgroundBorder::Background>_>_>
               ::end(&this->backgrounds);
  bVar1 = ::std::operator!=(&local_28,(_Self *)&background);
  if (bVar1) {
    ppVar2 = ::std::
             _Rb_tree_iterator<std::pair<const_Rml::ElementBackgroundBorder::BackgroundType,_Rml::ElementBackgroundBorder::Background>_>
             ::operator->(&local_28);
    this_local = (ElementBackgroundBorder *)&ppVar2->second;
  }
  else {
    this_local = (ElementBackgroundBorder *)
                 ::std::
                 map<Rml::ElementBackgroundBorder::BackgroundType,_Rml::ElementBackgroundBorder::Background,_std::less<Rml::ElementBackgroundBorder::BackgroundType>,_std::allocator<std::pair<const_Rml::ElementBackgroundBorder::BackgroundType,_Rml::ElementBackgroundBorder::Background>_>_>
                 ::operator[](&this->backgrounds,(key_type *)((long)&it._M_node + 4));
  }
  return (Background *)this_local;
}

Assistant:

ElementBackgroundBorder::Background& ElementBackgroundBorder::GetOrCreateBackground(BackgroundType type)
{
	auto it = backgrounds.find(type);
	if (it != backgrounds.end())
		return it->second;

	Background& background = backgrounds[type];
	return background;
}